

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O3

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  unsigned_short ***pppuVar4;
  ImageU16 *pIVar5;
  byte bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  IOException *pIVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auStack_388 [7];
  allocator local_381;
  void *local_380;
  void *local_378;
  long local_370;
  ulong local_368;
  long local_360;
  long local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  ImageU16 *local_338;
  long local_330;
  long local_328;
  long local_320;
  int depth;
  long local_310;
  pos_type local_308;
  long local_2f8;
  long local_2f0;
  long height;
  long width;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  void *local_2c0;
  void *local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  ulong local_298;
  long local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  long maxval;
  float scale;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_228;
  uchar **ppuStack_218;
  uchar **local_210;
  uchar ***pppuStack_208;
  
  local_358 = x;
  local_338 = image;
  iVar8 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar8 == '\0') {
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_288,name,&local_381);
    std::operator+(&local_258,"Can only load PNM image (",&local_288);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_258);
    _in = (pointer)*plVar11;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_in == paVar12) {
      aStack_228._M_allocated_capacity = paVar12->_M_allocated_capacity;
      aStack_228._8_8_ = plVar11[3];
      _in = (pointer)&aStack_228;
    }
    else {
      aStack_228._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    *plVar11 = (long)paVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    gutil::IOException::IOException(pIVar10,(string *)&in);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_308 = anon_unknown_11::readPNMHeader(name,&depth,&maxval,&scale,&width,&height);
  pIVar5 = local_338;
  if ((scale != 0.0) || (NAN(scale))) {
    pIVar10 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_288,name,&local_381);
    std::operator+(&local_258,"A float image cannot be loaded as 16 bit image (",&local_288);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_258);
    _in = (pointer)*plVar11;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_in == paVar12) {
      aStack_228._M_allocated_capacity = paVar12->_M_allocated_capacity;
      aStack_228._8_8_ = plVar11[3];
      _in = (pointer)&aStack_228;
    }
    else {
      aStack_228._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    *plVar11 = (long)paVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    gutil::IOException::IOException(pIVar10,(string *)&in);
    __cxa_throw(pIVar10,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  if (maxval < 0x100) {
    _in = _in & 0xffffffff00000000;
    aStack_228._M_allocated_capacity = 0;
    aStack_228._8_8_ = 0;
    ppuStack_218 = (uchar **)0x0;
    local_210 = (uchar **)0x0;
    pppuStack_208 = (uchar ***)0x0;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,0,0,1);
    (*(this->super_BasicImageIO)._vptr_BasicImageIO[6])
              (this,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,name,
               (ulong)(uint)ds,local_358,y,w,h);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<unsigned_char>
              (local_338,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
  }
  else {
    uVar9 = 1;
    if (1 < ds) {
      uVar9 = ds;
    }
    if (w < 0) {
      w = (long)(width + (ulong)uVar9 + -1) / (long)(ulong)uVar9;
    }
    if (h < 0) {
      h = (long)(height + (ulong)uVar9 + -1) / (long)(ulong)uVar9;
    }
    local_350 = CONCAT44(local_350._4_4_,uVar9);
    local_368 = (ulong)depth;
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(local_338,w,h,local_368);
    lVar18 = pIVar5->n;
    lVar16 = -lVar18;
    if (0 < lVar18) {
      lVar16 = lVar18;
    }
    memset(pIVar5->pixel,0,lVar16 * 2);
    std::ifstream::ifstream(&in);
    local_370 = CONCAT44(local_370._4_4_,ds);
    lVar18 = *(long *)(_in + -0x18);
    *(undefined4 *)((long)&aStack_228 + lVar18 + 0xc) = 7;
    std::ios::clear((int)auStack_388 + (int)lVar18 + 0x150);
    std::ifstream::open((char *)&in,(_Ios_Openmode)name);
    iVar8 = (int)local_368;
    uVar13 = local_368 & 0xffffffff;
    local_330 = height;
    local_310 = h;
    local_2f0 = w;
    if (((((int)local_370 < 2) && (y == 0 && local_358 == 0)) && (w == width)) && (h == height)) {
      std::istream::seekg(&in,local_308._M_off,local_308._M_state);
      if (0 < h) {
        uVar13 = local_368 & 0xffffffff;
        lVar18 = 0;
        do {
          if (0 < w) {
            lVar16 = 0;
            do {
              if (0 < iVar8) {
                uVar20 = 0;
                do {
                  if (ppuStack_218 < local_210) {
                    uVar7 = (ushort)*(byte *)ppuStack_218;
                    ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                  }
                  else {
                    uVar7 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                  }
                  if (ppuStack_218 < local_210) {
                    bVar6 = *(byte *)ppuStack_218;
                    ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                  }
                  else {
                    bVar6 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                  }
                  local_338->img[uVar20][lVar18][lVar16] = (ushort)bVar6 | uVar7 << 8;
                  uVar20 = uVar20 + 1;
                } while (uVar13 != uVar20);
              }
              lVar16 = lVar16 + 1;
              w = local_2f0;
            } while (lVar16 != local_2f0);
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 != local_310);
      }
    }
    else {
      local_360 = width;
      lVar18 = w * local_368;
      local_348 = lVar18 * 4;
      local_380 = operator_new(local_348);
      uVar20 = local_348;
      if (lVar18 != 0) {
        memset(local_380,0,local_348);
      }
      local_378 = operator_new(uVar20);
      if (lVar18 != 0) {
        memset(local_378,0,local_348);
      }
      lVar16 = 0;
      if (-y != 0 && y < 1) {
        lVar16 = -y;
      }
      if (lVar16 < h) {
        local_2a8 = 0;
        if (0 < local_358) {
          local_2a8 = local_358;
        }
        local_340 = local_350 & 0xffffffff;
        local_2a8 = local_2a8 * local_340;
        local_2b0 = local_368 * 2;
        local_328 = -local_358;
        if (-local_358 == 0 || 0 < local_358) {
          local_328 = 0;
        }
        local_2d8 = local_328 * local_368;
        local_320 = (long)(int)local_370;
        local_2b8 = (void *)((long)local_378 + local_2d8 * 4);
        local_290 = local_368 * 4;
        local_2c0 = (void *)((long)local_380 + local_2d8 * 4);
        local_2d0 = lVar18;
        local_2c8 = y;
        do {
          uVar20 = local_348;
          local_2a0 = (lVar16 + local_2c8) * local_340;
          if (local_330 <= local_2a0) break;
          local_2f8 = lVar16;
          if (local_2d0 != 0) {
            memset(local_380,0,local_348);
            memset(local_378,0,uVar20);
          }
          uVar20 = 0;
          do {
            if (local_330 <= (long)(uVar20 + local_2a0)) break;
            local_298 = uVar20;
            std::istream::seekg(&in,((uVar20 + local_2a0) * local_360 + local_2a8) * local_2b0 +
                                    local_308._M_off,local_308._M_state);
            lVar18 = local_360;
            pvVar14 = local_2b8;
            lVar16 = local_320;
            lVar15 = local_328;
            pvVar19 = local_2c0;
            if (local_328 < w) {
              do {
                uVar20 = (lVar15 + local_358) * local_340;
                if (lVar18 <= (long)uVar20) break;
                lVar17 = 0;
                do {
                  if (0 < iVar8) {
                    uVar21 = 0;
                    do {
                      if (ppuStack_218 < local_210) {
                        uVar9 = (uint)*(byte *)ppuStack_218;
                        ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                      }
                      else {
                        local_370 = lVar15;
                        local_350 = uVar20;
                        uVar9 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                        lVar18 = local_360;
                        lVar16 = local_320;
                        lVar15 = local_370;
                        uVar20 = local_350;
                      }
                      if (ppuStack_218 < local_210) {
                        bVar6 = *(byte *)ppuStack_218;
                        ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                      }
                      else {
                        local_370 = lVar15;
                        local_350 = uVar20;
                        bVar6 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                        lVar18 = local_360;
                        lVar16 = local_320;
                        lVar15 = local_370;
                        uVar20 = local_350;
                      }
                      piVar1 = (int *)((long)pvVar19 + uVar21 * 4);
                      *piVar1 = *piVar1 + ((uVar9 & 0xff) << 8 | (uint)bVar6);
                      piVar1 = (int *)((long)pvVar14 + uVar21 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar21 = uVar21 + 1;
                    } while (uVar13 != uVar21);
                  }
                } while ((lVar17 + 1 < lVar16) &&
                        (lVar2 = uVar20 + lVar17, lVar17 = lVar17 + 1, lVar2 + 1 < lVar18));
                lVar15 = lVar15 + 1;
                pvVar14 = (void *)((long)pvVar14 + local_290);
                pvVar19 = (void *)((long)pvVar19 + local_290);
                w = local_2f0;
              } while (lVar15 != local_2f0);
            }
            uVar20 = local_298 + 1;
          } while (uVar20 != local_340);
          lVar18 = local_328;
          lVar16 = local_2d8;
          if (local_328 < w) {
            do {
              if (local_360 <= (long)((local_358 + lVar18) * local_340)) break;
              if (0 < (int)local_368) {
                pppuVar4 = local_338->img;
                uVar20 = 0;
                do {
                  iVar3 = *(int *)((long)local_378 + uVar20 * 4 + lVar16 * 4);
                  if (0 < iVar3) {
                    pppuVar4[uVar20][local_2f8][lVar18] =
                         (unsigned_short)
                         (*(int *)((long)local_380 + uVar20 * 4 + lVar16 * 4) / iVar3);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar13 != uVar20);
                lVar16 = lVar16 + uVar20;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != w);
          }
          lVar16 = local_2f8 + 1;
        } while (lVar16 != local_310);
      }
      operator_delete(local_378);
      operator_delete(local_380);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
  }
  return;
}

Assistant:

void PNMImageIO::load(ImageU16 &image, const char *name, int ds, long x,
                      long y, long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    throw gutil::IOException("A float image cannot be loaded as 16 bit image ("+std::string(name)+")");
  }

  if (maxval > 255)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, depth);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(name, std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<ImageU16::work_t> vline(0, w*depth);
        std::valarray<int> nline(0, w*depth);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(pos+static_cast<std::streamoff>((y+k)*ds+kk)*width*depth*2+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*depth*2);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x)*depth;

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                for (int d=0; d<depth; d++)
                {
                  ImageU16::store_t v;

                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);

                  if (image.isValidS(v))
                  {
                    vline[j+d]+=v;
                    nline[j+d]++;
                  }
                }
              }

              j+=depth;
            }
          }

          // store line into image

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              if (nline[j] > 0)
              {
                image.set(i, k, d, static_cast<ImageU16::store_t>(vline[j]/nline[j]));
              }

              j++;
            }
          }
        }
      }
      else // load whole image
      {
        in.seekg(pos);
        std::streambuf *sb=in.rdbuf();

        for (long k=0; k<height; k++)
        {
          for (long i=0; i<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU16::store_t v;

              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);

              image.set(i, k, d, v);
            }
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}